

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

LArYieldResult * __thiscall
NEST::LArNEST::LegacyGetYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double efield,
          double yieldFactor,double excitationRatio,double epsilon,double recombProb)

{
  double dVar1;
  double dVar2;
  RandomGen *pRVar3;
  int64_t iVar4;
  uint uVar5;
  ulong N0;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  
  dVar1 = energy * 51282.05128205128 * 0.107;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  pRVar3 = RandomGen::rndm();
  dVar2 = RandomGen::rand_gauss(pRVar3,yieldFactor,yieldFactor * 0.25,true);
  pRVar3 = RandomGen::rndm();
  dVar1 = RandomGen::rand_gauss(pRVar3,energy * 51282.05128205128,dVar1,true);
  dVar1 = floor(dVar1 + 0.5);
  uVar5 = (uint)dVar1;
  uVar6 = 0;
  uVar7 = 0x3ff00000;
  if (yieldFactor < 1.0) {
    if (dVar2 <= 1.0) {
      uVar6 = SUB84(dVar2,0);
      uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    pRVar3 = RandomGen::rndm();
    iVar4 = RandomGen::binom_draw(pRVar3,(long)(int)uVar5,(double)CONCAT44(uVar7,uVar6));
    uVar5 = (uint)iVar4;
  }
  N0 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    N0 = 0;
  }
  if (energy < 1.95e-05) {
    N0 = 0;
  }
  pRVar3 = RandomGen::rndm();
  iVar4 = RandomGen::binom_draw(pRVar3,N0,excitationRatio / (excitationRatio + 1.0));
  dVar1 = (double)iVar4;
  dVar8 = (double)(int)N0 - dVar1;
  pRVar3 = RandomGen::rndm();
  iVar4 = RandomGen::binom_draw(pRVar3,(long)dVar8,recombProb);
  dVar2 = (double)iVar4 + dVar1;
  dVar11 = (double)(int)N0 - dVar2;
  auVar9._0_8_ = dVar2 + dVar11;
  auVar9._8_8_ = dVar11;
  auVar10._8_8_ = energy;
  auVar10._0_8_ = energy;
  auVar10 = divpd(auVar9,auVar10);
  __return_storage_ptr__->TotalYield = (double)auVar10._0_8_;
  __return_storage_ptr__->QuantaYield = (double)auVar10._8_8_;
  __return_storage_ptr__->LightYield = dVar2 / energy;
  __return_storage_ptr__->Nph = dVar2;
  __return_storage_ptr__->Ne = dVar11;
  __return_storage_ptr__->Nex = dVar1;
  __return_storage_ptr__->Nion = dVar8;
  __return_storage_ptr__->Lindhard = 0.0;
  __return_storage_ptr__->ElectricField = efield;
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::LegacyGetYields(double energy, double efield,
                                        double yieldFactor,
                                        double excitationRatio, double epsilon,
                                        double recombProb) {
  // determine ultimate number of quanta from current E-deposition (ph+e-)
  // total mean number of exc/ions the total number of either quanta produced
  // is equal to product of the work function, the energy deposited,
  // and yield reduction, for NR
  double MeanNq = legacy_scint_yield * energy;
  double sigma = sqrt(legacy_resolution_scale * MeanNq);  // Fano
  double leftvar =
      RandomGen::rndm()->rand_gauss(yieldFactor, 0.25 * yieldFactor, true);
  if (leftvar > 1.0) {
    leftvar = 1.0;
  }
  int Nq = int(floor(RandomGen::rndm()->rand_gauss(MeanNq, sigma, true) + 0.5));
  if (yieldFactor < 1) {
    Nq = RandomGen::rndm()->binom_draw(Nq, leftvar);
  }

  // if Edep below work function, can't make any quanta, and if Nq
  // less than zero because Gaussian fluctuated low, update to zero
  if (energy < 1 / legacy_scint_yield || Nq < 0) {
    Nq = 0;
  }

  // next section binomially assigns quanta to excitons and ions
  double Nex = RandomGen::rndm()->binom_draw(
      Nq, excitationRatio / (1 + excitationRatio));
  double Nion = Nq - Nex;

  // use binomial distribution to assign photons, electrons, where photons
  // are excitons plus recombined ionization electrons, while final
  // collected electrons are the "escape" (non-recombined) electrons
  double Nph = Nex + RandomGen::rndm()->binom_draw(Nion, recombProb);
  double Ne = Nq - Nph;

  // create the quanta results
  LArYieldResult result{(Ne + Nph) / energy,
                        Ne / energy,
                        Nph / energy,
                        Nph,
                        Ne,
                        Nex,
                        Nion,
                        0.0,
                        efield};
  return result;
}